

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  undefined1 in_SIL;
  int in_EDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *popup_window;
  ImGuiWindow *focus_window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImGuiWindow *this;
  undefined3 in_stack_fffffffffffffff8;
  uint uVar3;
  
  pIVar1 = GImGui;
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff8) & 0x1ffffff;
  pIVar2 = ImVector<ImGuiPopupData>::operator[](&GImGui->OpenPopupStack,in_EDI);
  window = pIVar2->SourceWindow;
  pIVar2 = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,in_EDI);
  this = pIVar2->Window;
  ImVector<ImGuiPopupData>::resize((ImVector<ImGuiPopupData> *)this,in_stack_ffffffffffffffdc);
  if ((uVar3 & 0x1000000) != 0) {
    if (((window == (ImGuiWindow *)0x0) || ((window->WasActive & 1U) != 0)) ||
       (this == (ImGuiWindow *)0x0)) {
      if ((pIVar1->NavLayer == ImGuiNavLayer_Main) && (window != (ImGuiWindow *)0x0)) {
        NavRestoreLastChildNavWindow(window);
      }
      FocusWindow(unaff_retaddr);
    }
    else {
      FocusTopMostWindowUnderOne(unaff_retaddr,(ImGuiWindow *)CONCAT44(in_EDI,uVar3));
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}